

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyBlitImage::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  VkExtent3D *pVVar1;
  VkImageType VVar2;
  Resource *pRVar3;
  OperationContext *pOVar4;
  undefined8 uVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  ImplementationBase *this_00;
  NotSupportedError *this_01;
  ulong uVar8;
  deUint32 dVar9;
  VkFormatProperties VVar10;
  
  if (this->m_type == TYPE_COPY) {
    this_00 = (ImplementationBase *)operator_new(0x90);
    ImplementationBase::ImplementationBase(this_00,context,resource,this->m_mode);
    (this_00->super_Operation)._vptr_Operation = (_func_int **)&PTR__ImplementationBase_00d30a08;
    pRVar3 = this_00->m_resource;
    pOVar4 = *(OperationContext **)&(pRVar3->m_imageData).subresourceLayers.baseArrayLayer;
    this_00[1].super_Operation._vptr_Operation =
         *(_func_int ***)&(pRVar3->m_imageData).subresourceLayers;
    this_00[1].m_context = pOVar4;
    this_00[1].m_resource = (Resource *)0x0;
    this_00[1].m_mode = ACCESS_MODE_READ;
    uVar5 = *(undefined8 *)&(pRVar3->m_imageData).subresourceLayers.baseArrayLayer;
    *(undefined8 *)&this_00[1].field_0x1c = *(undefined8 *)&(pRVar3->m_imageData).subresourceLayers;
    *(undefined8 *)((long)&this_00[1].m_bufferSize + 4) = uVar5;
    *(undefined8 *)
     ((long)&this_00[1].m_hostBuffer.
             super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             .m_data.ptr + 4) = 0;
    *(undefined4 *)
     &this_00[1].m_hostBuffer.
      super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
      .m_data.field_0xc = 0;
    *(deUint32 *)
     &this_00[1].m_image.
      super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
      .m_data.field_0x8 = (pRVar3->m_imageData).extent.depth;
    this_00[1].m_image.
    super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>.
    m_data.ptr = *(Image **)&(pRVar3->m_imageData).extent;
    goto LAB_007d6acb;
  }
  this_00 = (ImplementationBase *)operator_new(0x98);
  ImplementationBase::ImplementationBase(this_00,context,resource,this->m_mode);
  (this_00->super_Operation)._vptr_Operation = (_func_int **)&PTR__ImplementationBase_00d30ab8;
  pRVar3 = this_00->m_resource;
  pOVar4 = *(OperationContext **)&(pRVar3->m_imageData).subresourceLayers.baseArrayLayer;
  this_00[1].super_Operation._vptr_Operation =
       *(_func_int ***)&(pRVar3->m_imageData).subresourceLayers;
  this_00[1].m_context = pOVar4;
  this_00[1].m_resource = (Resource *)0x0;
  this_00[1].m_mode = ACCESS_MODE_READ;
  pVVar1 = &(pRVar3->m_imageData).extent;
  uVar8._0_4_ = pVVar1->width;
  uVar8._4_4_ = pVVar1->height;
  VVar2 = (pRVar3->m_imageData).imageType;
  if (VVar2 == VK_IMAGE_TYPE_3D) {
    dVar9 = (pRVar3->m_imageData).extent.depth;
  }
  else {
    if (VVar2 == VK_IMAGE_TYPE_2D) {
      uVar8 = (ulong)(pRVar3->m_imageData).extent.height << 0x20;
    }
    else {
      if (VVar2 != VK_IMAGE_TYPE_1D) {
        dVar9 = 0;
        uVar8 = 0;
        goto LAB_007d6a76;
      }
      uVar8 = 0x100000000;
    }
    uVar8 = pVVar1->width | uVar8;
    dVar9 = 1;
  }
LAB_007d6a76:
  *(ulong *)&this_00[1].field_0x1c = uVar8;
  *(deUint32 *)((long)&this_00[1].m_bufferSize + 4) = dVar9;
  dVar6 = (pRVar3->m_imageData).subresourceLayers.baseArrayLayer;
  dVar7 = (pRVar3->m_imageData).subresourceLayers.layerCount;
  this_00[1].m_hostBuffer.
  super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>.
  m_data.ptr = *(Buffer **)&(pRVar3->m_imageData).subresourceLayers;
  *(deUint32 *)
   &this_00[1].m_hostBuffer.
    super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
    .m_data.field_0x8 = dVar6;
  *(deUint32 *)
   &this_00[1].m_hostBuffer.
    super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
    .m_data.field_0xc = dVar7;
  this_00[1].m_image.
  super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>.
  m_data.ptr = (Image *)0x0;
  *(undefined4 *)
   &this_00[1].m_image.
    super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>.
    m_data.field_0x8 = 0;
  *(ulong *)&this_00[1].m_image.
             super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
             .m_data.field_0xc = uVar8;
  *(deUint32 *)((long)&this_00[2].super_Operation._vptr_Operation + 4) = dVar9;
  VVar10 = ::vk::getPhysicalDeviceFormatProperties
                     (this_00->m_context->m_vki,this_00->m_context->m_physicalDevice,
                      (pRVar3->m_imageData).format);
  if ((~VVar10._0_8_ & 0xc0000000000) != 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Format doesn\'t support blits",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperation.cpp"
               ,0x33f);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_007d6acb:
  (__return_storage_ptr__->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = &this_00->super_Operation;
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		if (m_type == TYPE_COPY)
			return de::MovePtr<Operation>(new CopyImplementation(context, resource, m_mode));
		else
			return de::MovePtr<Operation>(new BlitImplementation(context, resource, m_mode));
	}